

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jemalloc_internal_inlines_a.h
# Opt level: O2

arena_t * arena_get(tsdn_t *tsdn,uint ind,_Bool init_if_missing)

{
  arena_t *paVar1;
  
  if ((arena_t *)arenas[ind].repr != (arena_t *)0x0) {
    return (arena_t *)arenas[ind].repr;
  }
  if (init_if_missing) {
    paVar1 = arena_init(tsdn,ind,&extent_hooks_default);
    return paVar1;
  }
  return (arena_t *)0x0;
}

Assistant:

static inline arena_t *
arena_get(tsdn_t *tsdn, unsigned ind, bool init_if_missing) {
	arena_t *ret;

	assert(ind < MALLOCX_ARENA_LIMIT);

	ret = (arena_t *)atomic_load_p(&arenas[ind], ATOMIC_ACQUIRE);
	if (unlikely(ret == NULL)) {
		if (init_if_missing) {
			ret = arena_init(tsdn, ind,
			    (extent_hooks_t *)&extent_hooks_default);
		}
	}
	return ret;
}